

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O3

void __thiscall soplex::CLUFactorRational::eliminatePivot(CLUFactorRational *this,int prow,int pos)

{
  int iVar1;
  int p_col;
  Pring *pPVar2;
  Pring *pPVar3;
  Pring *pPVar4;
  pointer pnVar5;
  Rational *pRVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  long lVar10;
  int iVar11;
  int *piVar12;
  int *piVar13;
  int *piVar14;
  long lVar15;
  int iVar16;
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  *pcVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  *this_00;
  Rational pval;
  longlong local_80;
  data_type local_78;
  undefined4 local_68;
  undefined2 local_64;
  char local_62;
  data_type local_58;
  undefined4 local_48;
  undefined2 local_44;
  char local_42;
  
  local_78.la[0] = 0;
  local_68 = 1;
  local_64 = 0x100;
  local_62 = '\0';
  local_58.la[0] = 1;
  local_48 = 1;
  local_44 = 0x100;
  local_42 = '\0';
  piVar13 = (this->u).row.len;
  iVar20 = (this->u).row.start[prow];
  lVar15 = (long)iVar20;
  iVar1 = piVar13[prow];
  iVar16 = (int)((long)iVar1 + -1);
  piVar13[prow] = iVar16;
  iVar11 = pos + iVar20;
  p_col = (this->u).row.idx[iVar11];
  pcVar17 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
             *)((this->u).row.val.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                ._M_impl.super__Vector_impl_data._M_start + iVar11);
  boost::multiprecision::backends::
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            *)&local_78.ld,pcVar17);
  boost::multiprecision::backends::
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            *)&local_58.ld,pcVar17 + 1);
  pPVar2 = (this->temp).pivot_col;
  pPVar3 = pPVar2[p_col].next;
  pPVar4 = pPVar2[p_col].prev;
  pPVar3->prev = pPVar4;
  pPVar4->next = pPVar3;
  pPVar2[p_col].next = pPVar2 + p_col;
  pPVar2[p_col].prev = pPVar2 + p_col;
  piVar13 = (this->u).row.idx;
  lVar18 = (long)(iVar20 + iVar16);
  piVar13[iVar11] = piVar13[lVar18];
  pnVar5 = (this->u).row.val.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar17 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
             *)(pnVar5 + lVar18);
  this_00 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
             *)(pnVar5 + iVar11);
  boost::multiprecision::backends::
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  ::assign(this_00,pcVar17);
  boost::multiprecision::backends::
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  ::assign(this_00 + 1,pcVar17 + 1);
  iVar20 = (this->temp).stage;
  (this->temp).stage = iVar20 + 1;
  setPivot(this,iVar20,p_col,prow,(Rational *)&local_78.ld);
  iVar20 = (this->temp).s_cact[p_col];
  iVar11 = -1;
  if (1 < iVar20) {
    iVar11 = (this->l).startSize;
    iVar16 = (this->l).firstUnused;
    if (iVar11 <= iVar16) {
      iVar11 = iVar11 + 100;
      (this->l).startSize = iVar11;
      spx_realloc<int*>(&(this->l).start,iVar11);
      iVar16 = (this->l).firstUnused;
    }
    piVar13 = (this->l).row;
    piVar8 = (this->l).start;
    lVar10 = (long)iVar16;
    iVar11 = piVar8[lVar10];
    iVar16 = iVar20 + -1 + iVar11;
    iVar20 = (int)((ulong)((long)(this->l).val.val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->l).val.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 6);
    if (iVar20 < iVar16) {
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::reDim(&(this->l).val,(int)((double)iVar16 + (double)iVar20 * 0.2),true);
      spx_realloc<int*>(&(this->l).idx,
                        (int)((ulong)((long)(this->l).val.val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->l).val.val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 6));
      lVar10 = (long)(this->l).firstUnused;
      piVar8 = (this->l).start;
    }
    piVar13[lVar10] = prow;
    iVar20 = (this->l).firstUnused;
    (this->l).firstUnused = iVar20 + 1;
    piVar8[(long)iVar20 + 1] = iVar16;
  }
  if (iVar1 < 2) {
    piVar9 = (this->u).col.len;
    piVar13 = (this->temp).s_cact;
    piVar8 = (this->u).col.idx;
    piVar12 = (this->u).col.start;
  }
  else {
    do {
      iVar20 = (this->u).row.idx[lVar15];
      (this->temp).s_mark[iVar20] = 1;
      pcVar17 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)((this->u).row.val.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar15);
      pRVar6 = this->work;
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)(pRVar6 + iVar20),pcVar17);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)(pRVar6 + iVar20) + 1,pcVar17 + 1);
      pPVar2 = (this->temp).pivot_col;
      pPVar3 = pPVar2[iVar20].next;
      pPVar2 = pPVar2[iVar20].prev;
      pPVar3->prev = pPVar2;
      pPVar2->next = pPVar3;
      piVar8 = (this->u).col.idx;
      piVar12 = (this->u).col.start;
      piVar9 = (this->u).col.len;
      piVar13 = (this->temp).s_cact;
      iVar16 = (piVar9[iVar20] + piVar12[iVar20]) - piVar13[iVar20];
      piVar7 = piVar8 + iVar16;
      do {
        piVar14 = piVar7;
        piVar7 = piVar14 + 1;
      } while (*piVar14 != prow);
      *piVar14 = piVar8[iVar16];
      piVar8[iVar16] = prow;
      piVar13[iVar20] = piVar13[iVar20] + -1;
      lVar15 = lVar15 + 1;
    } while (lVar15 < lVar18);
  }
  iVar16 = piVar9[p_col];
  uVar21 = (long)iVar16 - (long)piVar13[p_col];
  iVar20 = piVar8[(long)piVar12[p_col] + uVar21];
  if (iVar20 != prow) {
    do {
      updateRow(this,iVar20,iVar11,prow,p_col,(Rational *)&local_78.ld);
      iVar11 = iVar11 + 1;
      uVar19 = (int)uVar21 + 1;
      uVar21 = (ulong)uVar19;
      iVar20 = (this->u).col.idx[(int)((this->u).col.start[p_col] + uVar19)];
    } while (iVar20 != prow);
    piVar9 = (this->u).col.len;
    iVar16 = piVar9[p_col];
  }
  iVar20 = (int)uVar21 + 1;
  if (iVar20 < iVar16) {
    do {
      updateRow(this,(this->u).col.idx[(this->u).col.start[p_col] + iVar20],iVar11,prow,p_col,
                (Rational *)&local_78.ld);
      iVar11 = iVar11 + 1;
      iVar20 = iVar20 + 1;
    } while (iVar16 != iVar20);
    piVar9 = (this->u).col.len;
    iVar16 = piVar9[p_col];
  }
  piVar9[p_col] = iVar16 - (this->temp).s_cact[p_col];
  if (1 < iVar1) {
    lVar18 = (long)(this->u).row.start[prow];
    lVar15 = (long)iVar1 + -1 + lVar18;
    do {
      iVar20 = (this->u).row.idx[lVar18];
      local_80 = 0;
      boost::
      rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
      ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                   *)(this->work + iVar20),&local_80);
      (this->temp).s_mark[iVar20] = 0;
      pPVar2 = (this->temp).pivot_colNZ;
      pPVar3 = (this->temp).pivot_col;
      iVar1 = (this->temp).s_cact[iVar20];
      pPVar4 = pPVar2[iVar1].next;
      pPVar3[iVar20].next = pPVar4;
      pPVar4->prev = pPVar3 + iVar20;
      pPVar3[iVar20].prev = pPVar2 + iVar1;
      pPVar2[iVar1].next = pPVar3 + iVar20;
      lVar18 = lVar18 + 1;
    } while (lVar18 < lVar15);
  }
  if ((local_44._1_1_ == '\0') && (local_42 == '\0')) {
    operator_delete(local_58.ld.data,(local_58.la[0] & 0xffffffff) << 3);
  }
  if ((local_64._1_1_ == '\0') && (local_62 == '\0')) {
    operator_delete(local_78.ld.data,(local_78.la[0] & 0xffffffff) << 3);
  }
  return;
}

Assistant:

inline void CLUFactorRational::eliminatePivot(int prow, int pos)
{
   int i, j, k, m = -1;
   int lv = -1;  // This value should never be used.
   int pcol;
   Rational pval;
   int pbeg = u.row.start[prow];
   int plen = --(u.row.len[prow]);
   int pend = pbeg + plen;


   /*  extract pivot element   */
   i = pbeg + pos;
   pcol = u.row.idx[i];
   pval = u.row.val[i];
   removeDR(temp.pivot_col[pcol]);
   initDR(temp.pivot_col[pcol]);

   /*  remove pivot from pivot row     */
   u.row.idx[i] = u.row.idx[pend];
   u.row.val[i] = u.row.val[pend];

   /*  set pivot element and construct L vector */
   setPivot(temp.stage++, pcol, prow, pval);

   /**@todo If this test failes, lv has no value. I suppose that in this
    *       case none of the loops below that uses lv is executed.
    *       But this is unproven.
    */

   if(temp.s_cact[pcol] - 1 > 0)
      lv = makeLvec(temp.s_cact[pcol] - 1, prow);

   /*  init working vector,
    *  remove pivot row from working matrix
    *  and remove columns from list.
    */
   for(i = pbeg; i < pend; ++i)
   {
      j = u.row.idx[i];
      temp.s_mark[j] = 1;
      work[j] = u.row.val[i];
      removeDR(temp.pivot_col[j]);
      m = u.col.start[j] + u.col.len[j] - temp.s_cact[j];

      for(k = m; u.col.idx[k] != prow; ++k)
         ;

      u.col.idx[k] = u.col.idx[m];

      u.col.idx[m] = prow;

      temp.s_cact[j]--;
   }

   /*  perform L and update loop
    */
   for(i = u.col.len[pcol] - temp.s_cact[pcol];
         (m = u.col.idx[u.col.start[pcol] + i]) != prow;
         ++i)
   {
      assert(row.perm[m] < 0);
      assert(lv >= 0);
      /* coverity[negative_returns] */
      updateRow(m, lv++, prow, pcol, pval);
   }

   /*  skip pivot row  */

   m = u.col.len[pcol];

   for(++i; i < m; ++i)
   {
      assert(lv >= 0);
      /* coverity[negative_returns] */
      updateRow(u.col.idx[u.col.start[pcol] + i], lv++, prow, pcol, pval);
   }

   /*  remove pivot column from column file.
    */
   u.col.len[pcol] -= temp.s_cact[pcol];

   /*  clear working vector and reinsert columns to lists
    */
   for(i = u.row.start[prow], pend = i + plen; i < pend; ++i)
   {
      j = u.row.idx[i];
      work[j] = 0;
      temp.s_mark[j] = 0;
      init2DR(temp.pivot_col[j], temp.pivot_colNZ[temp.s_cact[j]]);
      assert(col.perm[j] < 0);
   }
}